

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection_handle.cpp
# Opt level: O0

torrent_handle __thiscall
libtorrent::peer_connection_handle::associated_torrent(peer_connection_handle *this)

{
  bool bVar1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  torrent_handle tVar2;
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  undefined1 local_28 [8];
  shared_ptr<libtorrent::aux::peer_connection> pc;
  peer_connection_handle *this_local;
  
  native_handle((peer_connection_handle *)local_28);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar1) {
    ::std::
    __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_28);
    libtorrent::aux::peer_connection::associated_torrent((peer_connection *)local_50);
    ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_40);
    ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
              ((weak_ptr<libtorrent::aux::torrent> *)local_50);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
    if (bVar1) {
      ::std::__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_40);
      libtorrent::aux::torrent::get_handle((torrent *)this);
    }
    else {
      memset(this,0,0x10);
      torrent_handle::torrent_handle((torrent_handle *)this);
    }
    t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)local_40);
  }
  else {
    memset(this,0,0x10);
    torrent_handle::torrent_handle((torrent_handle *)this);
    t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
  }
  ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::peer_connection> *)local_28);
  tVar2.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  tVar2.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (torrent_handle)
         tVar2.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

torrent_handle peer_connection_handle::associated_torrent() const
{
	std::shared_ptr<aux::peer_connection> pc = native_handle();
	if (!pc) return torrent_handle();
	auto t = pc->associated_torrent().lock();
	if (!t) return torrent_handle();
	return t->get_handle();
}